

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltests.c
# Opt level: O0

int lua_checkpc(lua_State *L,CallInfo *ci)

{
  long lVar1;
  bool local_39;
  StkId local_38;
  Proto *p;
  StkId f;
  CallInfo *ci_local;
  lua_State *L_local;
  
  if (((ci->callstatus & 2) == 0) || (ci->jitstatus != '\0')) {
    L_local._4_4_ = 1;
  }
  else {
    if ((L->status == '\x01') && (ci == L->ci)) {
      local_38 = (StkId)((long)&L->stack->value_ + ci->extra);
    }
    else {
      local_38 = ci->func;
    }
    if (local_38->tt_ != 0x8006) {
      __assert_fail("((((f))->tt_) == (((((6) | ((0) << 4))) | (1 << 15))))",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltests.c"
                    ,0x14e,"int lua_checkpc(lua_State *, CallInfo *)");
    }
    if (((local_38->value_).gc)->tt != '\x06') {
      __assert_fail("(((f)->value_).gc)->tt == ((6) | ((0) << 4))",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltests.c"
                    ,0x14e,"int lua_checkpc(lua_State *, CallInfo *)");
    }
    lVar1 = *(long *)((local_38->value_).f + 0x18);
    local_39 = false;
    if (*(Instruction **)(lVar1 + 0x38) <= (ci->u).l.savedpc) {
      local_39 = (ci->u).l.savedpc <=
                 (Instruction *)(*(long *)(lVar1 + 0x38) + (long)*(int *)(lVar1 + 0x18) * 4);
    }
    L_local._4_4_ = (uint)local_39;
  }
  return L_local._4_4_;
}

Assistant:

static int lua_checkpc (lua_State *L, CallInfo *ci) {
  if (!isLua(ci) || isJITed(ci)) return 1;
  else {
    /* if function yielded (inside a hook), real 'func' is in 'extra' field */
    StkId f = (L->status != LUA_YIELD || ci != L->ci)
              ? ci->func
              : restorestack(L, ci->extra);
    Proto *p = clLvalue(f)->p;
    return p->code <= ci->u.l.savedpc &&
           ci->u.l.savedpc <= p->code + p->sizecode;
  }
}